

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_ugrid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_CELL pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  FILE *__stream;
  long lVar8;
  undefined8 uVar9;
  ulong global;
  char *pcVar10;
  REF_INT new_cell;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT face_id;
  REF_INT new_node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nnode;
  REF_INT new_qua;
  REF_INT new_tri;
  REF_INT nodes [27];
  REF_DBL xyz [3];
  uint local_f4;
  REF_CELL local_f0;
  int local_e4;
  int local_e0;
  REF_INT local_dc;
  uint local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  REF_DBL local_48;
  REF_DBL local_40;
  REF_DBL local_38;
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xf7
             ,"ref_import_ugrid","unable to open file");
      uVar4 = 2;
    }
    else {
      iVar5 = __isoc99_fscanf(__stream,"%d",&local_c4);
      if (iVar5 == 1) {
        iVar5 = __isoc99_fscanf(__stream,"%d",&local_e0);
        if (iVar5 == 1) {
          iVar5 = __isoc99_fscanf(__stream,"%d",&local_e4);
          if (iVar5 == 1) {
            iVar5 = __isoc99_fscanf(__stream,"%d",&local_c8);
            if (iVar5 == 1) {
              iVar5 = __isoc99_fscanf(__stream,"%d",&local_cc);
              if (iVar5 == 1) {
                iVar5 = __isoc99_fscanf(__stream,"%d",&local_d0);
                if (iVar5 == 1) {
                  iVar5 = __isoc99_fscanf(__stream,"%d",&local_d4);
                  if (iVar5 == 1) {
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid header");
                    }
                    if (0 < local_c4) {
                      global = 0;
                      do {
                        uVar4 = ref_node_add(ref_node,global,(REF_INT *)&local_d8);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x104,"ref_import_ugrid",(ulong)uVar4,"new_node");
                          return uVar4;
                        }
                        if (global != local_d8) {
                          pcVar10 = "node index";
                          uVar9 = 0x105;
                          goto LAB_00176a36;
                        }
                        iVar5 = __isoc99_fscanf(__stream,"%lf",&local_48);
                        if (iVar5 != 1) {
                          pcVar10 = "x";
                          uVar9 = 0x106;
                          goto LAB_00176a36;
                        }
                        iVar5 = __isoc99_fscanf(__stream,"%lf",&local_40);
                        if (iVar5 != 1) {
                          pcVar10 = "y";
                          uVar9 = 0x107;
                          goto LAB_00176a36;
                        }
                        iVar5 = __isoc99_fscanf(__stream,"%lf",&local_38);
                        if (iVar5 != 1) {
                          pcVar10 = "z";
                          uVar9 = 0x108;
                          goto LAB_00176a36;
                        }
                        pRVar2 = ref_node->real;
                        lVar8 = (long)(int)local_d8;
                        pRVar2[lVar8 * 0xf] = local_48;
                        pRVar2[lVar8 * 0xf + 1] = local_40;
                        pRVar2[lVar8 * 0xf + 2] = local_38;
                        global = global + 1;
                      } while ((long)global < (long)local_c4);
                    }
                    uVar4 = ref_node_initialize_n_global(ref_node,(long)local_c4);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x10e,"ref_import_ugrid",(ulong)uVar4,"init glob");
                      return uVar4;
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid node");
                    }
                    local_f0 = pRVar1->cell[3];
                    local_ac = -1;
                    if (0 < local_e0) {
                      iVar5 = 0;
                      do {
                        lVar8 = 0;
                        do {
                          iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar8);
                          if (iVar6 != 1) {
                            pcVar10 = "tri";
                            uVar9 = 0x116;
                            goto LAB_00176a36;
                          }
                          lVar8 = lVar8 + 4;
                        } while (lVar8 != 0xc);
                        local_b8 = local_b8 + -1;
                        local_b4 = local_b4 + -1;
                        local_b0 = local_b0 + -1;
                        uVar4 = ref_cell_add(local_f0,&local_b8,&local_bc);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x11a,"ref_import_ugrid",(ulong)uVar4,"new tri");
                          return uVar4;
                        }
                        if (iVar5 != local_bc) {
                          pcVar10 = "tri index";
                          uVar9 = 0x11b;
                          goto LAB_00176a36;
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_e0);
                    }
                    local_f0 = pRVar1->cell[6];
                    local_a8 = -1;
                    if (0 < local_e4) {
                      iVar5 = 0;
                      do {
                        lVar8 = 0;
                        do {
                          iVar6 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar8);
                          if (iVar6 != 1) {
                            pcVar10 = "qua";
                            uVar9 = 0x122;
                            goto LAB_00176a36;
                          }
                          lVar8 = lVar8 + 4;
                        } while (lVar8 != 0x10);
                        local_b8 = local_b8 + -1;
                        local_b4 = local_b4 + -1;
                        local_b0 = local_b0 + -1;
                        local_ac = local_ac + -1;
                        uVar4 = ref_cell_add(local_f0,&local_b8,&local_c0);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x127,"ref_import_ugrid",(ulong)uVar4,"new qua");
                          return uVar4;
                        }
                        if (iVar5 != local_c0) {
                          pcVar10 = "qua index";
                          uVar9 = 0x128;
                          goto LAB_00176a36;
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_e4);
                    }
                    if (0 < local_e0) {
                      pRVar3 = pRVar1->cell[3];
                      iVar5 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",&local_dc);
                        if (iVar6 != 1) {
                          pcVar10 = "tri id";
                          uVar9 = 0x12d;
                          goto LAB_00176a36;
                        }
                        pRVar3->c2n[(long)pRVar3->size_per * (long)iVar5 + 3] = local_dc;
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_e0);
                    }
                    if (0 < local_e4) {
                      pRVar3 = pRVar1->cell[6];
                      iVar5 = 0;
                      do {
                        iVar6 = __isoc99_fscanf(__stream,"%d",&local_dc);
                        if (iVar6 != 1) {
                          pcVar10 = "qua id";
                          uVar9 = 0x133;
                          goto LAB_00176a36;
                        }
                        pRVar3->c2n[(long)pRVar3->size_per * (long)iVar5 + 4] = local_dc;
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_e4);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid tri");
                    }
                    if (0 < local_c8) {
                      local_f0 = pRVar1->cell[8];
                      uVar4 = 0;
                      do {
                        lVar8 = 0;
                        do {
                          iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar8);
                          if (iVar5 != 1) {
                            pcVar10 = "tet";
                            uVar9 = 0x13b;
                            goto LAB_00176a36;
                          }
                          lVar8 = lVar8 + 4;
                        } while (lVar8 != 0x10);
                        local_b8 = local_b8 + -1;
                        local_b4 = local_b4 + -1;
                        local_b0 = local_b0 + -1;
                        local_ac = local_ac + -1;
                        uVar7 = ref_cell_add(local_f0,&local_b8,(REF_INT *)&local_f4);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x140,"ref_import_ugrid",(ulong)uVar7,"new tet");
                          return uVar7;
                        }
                        if (uVar4 != local_f4) {
                          pcVar10 = "tet index";
                          uVar9 = 0x141;
                          goto LAB_00176a36;
                        }
                        uVar4 = uVar4 + 1;
                      } while ((int)uVar4 < local_c8);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid tet");
                    }
                    if (0 < local_cc) {
                      local_f0 = pRVar1->cell[9];
                      uVar4 = 0;
                      do {
                        lVar8 = 0;
                        do {
                          iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar8);
                          if (iVar5 != 1) {
                            pcVar10 = "pyr";
                            uVar9 = 0x148;
                            goto LAB_00176a36;
                          }
                          lVar8 = lVar8 + 4;
                        } while (lVar8 != 0x14);
                        local_b8 = local_b8 + -1;
                        local_b4 = local_b4 + -1;
                        local_b0 = local_b0 + -1;
                        local_ac = local_ac + -1;
                        local_a8 = local_a8 + -1;
                        uVar7 = ref_cell_add(local_f0,&local_b8,(REF_INT *)&local_f4);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x14e,"ref_import_ugrid",(ulong)uVar7,"new pyr");
                          return uVar7;
                        }
                        if (uVar4 != local_f4) {
                          pcVar10 = "pyr index";
                          uVar9 = 0x14f;
                          goto LAB_00176a36;
                        }
                        uVar4 = uVar4 + 1;
                      } while ((int)uVar4 < local_cc);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid pyr");
                    }
                    if (0 < local_d0) {
                      local_f0 = pRVar1->cell[10];
                      uVar4 = 0;
                      do {
                        lVar8 = 0;
                        do {
                          iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar8);
                          if (iVar5 != 1) {
                            pcVar10 = "pri";
                            uVar9 = 0x156;
                            goto LAB_00176a36;
                          }
                          lVar8 = lVar8 + 4;
                        } while (lVar8 != 0x18);
                        local_b8 = local_b8 + -1;
                        local_b4 = local_b4 + -1;
                        local_b0 = local_b0 + -1;
                        local_ac = local_ac + -1;
                        local_a8 = local_a8 + -1;
                        local_a4 = local_a4 + -1;
                        uVar7 = ref_cell_add(local_f0,&local_b8,(REF_INT *)&local_f4);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x15d,"ref_import_ugrid",(ulong)uVar7,"new pri");
                          return uVar7;
                        }
                        if (uVar4 != local_f4) {
                          printf("cell %d %d\n",(ulong)uVar4);
                        }
                        if (uVar4 != local_f4) {
                          pcVar10 = "pri index";
                          uVar9 = 0x163;
                          goto LAB_00176a36;
                        }
                        uVar4 = uVar4 + 1;
                      } while ((int)uVar4 < local_d0);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid pri");
                    }
                    if (0 < local_d4) {
                      pRVar3 = pRVar1->cell[0xb];
                      uVar4 = 0;
                      do {
                        lVar8 = 0;
                        do {
                          iVar5 = __isoc99_fscanf(__stream,"%d",(long)&local_b8 + lVar8);
                          if (iVar5 != 1) {
                            pcVar10 = "hex";
                            uVar9 = 0x16a;
                            goto LAB_00176a36;
                          }
                          lVar8 = lVar8 + 4;
                        } while (lVar8 != 0x20);
                        local_b8 = local_b8 + -1;
                        local_b4 = local_b4 + -1;
                        local_b0 = local_b0 + -1;
                        local_ac = local_ac + -1;
                        local_a8 = local_a8 + -1;
                        local_a4 = local_a4 + -1;
                        local_a0 = local_a0 + -1;
                        local_9c = local_9c + -1;
                        uVar7 = ref_cell_add(pRVar3,&local_b8,(REF_INT *)&local_f4);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x173,"ref_import_ugrid",(ulong)uVar7,"new hex");
                          return uVar7;
                        }
                        if (uVar4 != local_f4) {
                          pcVar10 = "hex index";
                          uVar9 = 0x174;
                          goto LAB_00176a36;
                        }
                        uVar4 = uVar4 + 1;
                      } while ((int)uVar4 < local_d4);
                    }
                    if (0 < ref_mpi->timing) {
                      ref_mpi_stopwatch_stop(ref_mpi,"ugrid hex");
                    }
                    fclose(__stream);
                    return 0;
                  }
                  pcVar10 = "nhex";
                  uVar9 = 0xff;
                }
                else {
                  pcVar10 = "npri";
                  uVar9 = 0xfe;
                }
              }
              else {
                pcVar10 = "npyr";
                uVar9 = 0xfd;
              }
            }
            else {
              pcVar10 = "ntet";
              uVar9 = 0xfc;
            }
          }
          else {
            pcVar10 = "nqua";
            uVar9 = 0xfb;
          }
        }
        else {
          pcVar10 = "ntri";
          uVar9 = 0xfa;
        }
      }
      else {
        pcVar10 = "nnode";
        uVar9 = 0xf9;
      }
LAB_00176a36:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar9,"ref_import_ugrid",pcVar10);
      uVar4 = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xf1,
           "ref_import_ugrid",(ulong)uVar4,"create grid");
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_import_ugrid(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua, new_qua;
  REF_INT face_id;
  REF_INT cell, new_cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &ntet), "ntet");
  RES(1, fscanf(file, "%d", &npyr), "npyr");
  RES(1, fscanf(file, "%d", &npri), "npri");
  RES(1, fscanf(file, "%d", &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_qua(ref_grid);
  for (qua = 0; qua < nqua; qua++) {
    RES(1, fscanf(file, "%d", &face_id), "qua id");
    ref_cell_c2n(ref_cell, 4, qua) = face_id;
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");

  ref_cell = ref_grid_pyr(ref_grid);
  for (cell = 0; cell < npyr; cell++) {
    for (node = 0; node < 5; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "pyr");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new pyr");
    RES(cell, new_cell, "pyr index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");

  ref_cell = ref_grid_pri(ref_grid);
  for (cell = 0; cell < npri; cell++) {
    for (node = 0; node < 6; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "pri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    nodes[5]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new pri");

    if (cell != new_cell) {
      printf("cell %d %d\n", cell, new_cell);
    }

    RES(cell, new_cell, "pri index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");

  ref_cell = ref_grid_hex(ref_grid);
  for (cell = 0; cell < nhex; cell++) {
    for (node = 0; node < 8; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "hex");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    nodes[5]--;
    nodes[6]--;
    nodes[7]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new hex");
    RES(cell, new_cell, "hex index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}